

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O2

QByteArray * __thiscall
QHttpHeaders::combinedValue
          (QByteArray *__return_storage_ptr__,QHttpHeaders *this,QAnyStringView name)

{
  QHttpHeadersPrivate *this_00;
  long in_FS_OFFSET;
  _Variant_storage<false,_QHttpHeaders::WellKnownHeader,_QByteArray> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  this_00 = (this->d).d.ptr;
  if ((this_00 != (QHttpHeadersPrivate *)0x0) && ((this_00->headers).d.size != 0)) {
    HeaderName::HeaderName((HeaderName *)&local_40,name);
    QHttpHeadersPrivate::combinedValue(this_00,(HeaderName *)&local_40,__return_storage_ptr__);
    std::__detail::__variant::_Variant_storage<false,_QHttpHeaders::WellKnownHeader,_QByteArray>::
    _M_reset(&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QHttpHeaders::combinedValue(QAnyStringView name) const
{
    QByteArray result;
    if (isEmpty())
        return result;

    d->combinedValue(HeaderName{name}, result);
    return result;
}